

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMT_KEYEDHASH_SCHEME_Unmarshal
                 (TPMT_KEYEDHASH_SCHEME *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC TVar1;
  
  TVar1 = TPMI_ALG_KEYEDHASH_SCHEME_Unmarshal(&target->scheme,buffer,size,flag);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPMU_SCHEME_KEYEDHASH_Unmarshal(&target->details,buffer,size,(uint)target->scheme);
  return TVar1;
}

Assistant:

TPM_RC
TPMT_KEYEDHASH_SCHEME_Unmarshal(TPMT_KEYEDHASH_SCHEME *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPMI_ALG_KEYEDHASH_SCHEME_Unmarshal((TPMI_ALG_KEYEDHASH_SCHEME *)&(target->scheme), buffer, size, flag);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_SCHEME_KEYEDHASH_Unmarshal((TPMU_SCHEME_KEYEDHASH *)&(target->details), buffer, size, (UINT32)target->scheme);
    return result;
}